

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution1d.cpp
# Opt level: O3

int __thiscall
ncnn::Deconvolution1D::forward(Deconvolution1D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  int *piVar7;
  void *pvVar8;
  bool bVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  Mat *pMVar14;
  int iVar15;
  ulong uVar16;
  float *pfVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  float *pfVar21;
  ulong uVar22;
  void *pvVar23;
  ulong uVar24;
  float *pfVar25;
  float *pfVar26;
  long lVar27;
  bool bVar28;
  float fVar29;
  undefined1 auVar30 [16];
  int iVar32;
  undefined1 auVar31 [16];
  float fVar33;
  float fVar34;
  int iVar35;
  int iVar37;
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  Mat local_108;
  Option *local_b8;
  Mat *local_b0;
  ulong local_a8;
  long local_a0;
  Mat *local_98;
  void *local_90;
  void *local_88;
  long local_80;
  ulong local_78;
  ulong local_70;
  float *local_68;
  long local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  iVar18 = bottom_blob->w;
  sVar6 = bottom_blob->elemsize;
  iVar2 = this->kernel_w;
  iVar15 = this->output_pad_right;
  iVar32 = this->dilation_w;
  iVar35 = this->stride_w;
  local_108.cstep = 0;
  local_108.data = (float *)0x0;
  local_108.refcount._0_4_ = 0;
  local_108.refcount._4_4_ = 0;
  local_108.elemsize = 0;
  local_108.elempack = 0;
  local_108.allocator = (Allocator *)0x0;
  local_108.dims = 0;
  local_108.w = 0;
  local_108.h = 0;
  local_108.d = 0;
  local_108.c = 0;
  lVar27 = 0x10;
  if ((((this->pad_left < 1) && (this->pad_right < 1)) && (this->output_w < 1)) &&
     (lVar27 = 8, &local_108 != top_blob)) {
    piVar7 = top_blob->refcount;
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + 1;
      UNLOCK();
    }
    local_108.data = top_blob->data;
    local_108.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_108.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_108.elemsize = top_blob->elemsize;
    local_108.elempack = top_blob->elempack;
    local_108.allocator = top_blob->allocator;
    uVar10 = top_blob->dims;
    uVar11 = top_blob->w;
    uVar12 = top_blob->h;
    uVar13 = top_blob->d;
    local_108.c = top_blob->c;
    local_108.cstep = top_blob->cstep;
    local_108.dims = uVar10;
    local_108.w = uVar11;
    local_108.h = uVar12;
    local_108.d = uVar13;
  }
  local_b8 = opt;
  local_b0 = bottom_blob;
  Mat::create(&local_108,iVar15 + (iVar2 + -1) * iVar32 + (iVar18 + -1) * iVar35 + 1,
              this->num_output,sVar6,*(Allocator **)(&opt->lightmode + lVar27));
  iVar18 = -100;
  if (((float *)local_108.data != (float *)0x0) && ((long)local_108.c * local_108.cstep != 0)) {
    local_a8 = (ulong)(uint)local_108.h;
    local_90 = (this->bias_data).data;
    if (local_90 == (void *)0x0) {
      bVar28 = true;
    }
    else {
      bVar28 = (long)(this->bias_data).c * (this->bias_data).cstep == 0;
    }
    local_98 = top_blob;
    if (0 < local_108.h) {
      uVar3 = this->kernel_w;
      uVar4 = local_b0->w;
      uVar5 = local_b0->h;
      iVar18 = this->dilation_w;
      iVar2 = this->activation_type;
      local_a0 = (long)local_108.w;
      local_88 = (this->weight_data).data;
      uVar22 = (ulong)(uint)local_108.w;
      local_78 = (ulong)(local_108.w + 3U & 0xfffffffc);
      lVar27 = uVar22 - 1;
      auVar36._8_4_ = (int)lVar27;
      auVar36._0_8_ = lVar27;
      auVar36._12_4_ = (int)((ulong)lVar27 >> 0x20);
      pfVar25 = (float *)((long)local_108.data + 0xc);
      local_80 = local_108.elemsize * local_a0;
      local_60 = (long)this->stride_w << 2;
      auVar36 = auVar36 ^ _DAT_00552170;
      iVar15 = 0;
      uVar20 = 0;
      pfVar17 = (float *)local_108.data;
      auVar38 = _DAT_00552270;
      auVar39 = _DAT_00552280;
      auVar40 = _DAT_00552170;
      local_58 = auVar36;
      do {
        fVar29 = 0.0;
        if (!bVar28) {
          fVar29 = *(float *)((long)local_90 + uVar20 * 4);
        }
        if (0 < (int)local_a0) {
          uVar16 = 0;
          do {
            auVar30._8_4_ = (int)uVar16;
            auVar30._0_8_ = uVar16;
            auVar30._12_4_ = (int)(uVar16 >> 0x20);
            auVar31 = (auVar30 | auVar39) ^ auVar40;
            iVar35 = auVar36._0_4_;
            bVar9 = iVar35 < auVar31._0_4_;
            iVar32 = auVar31._4_4_;
            iVar37 = auVar36._4_4_;
            if ((bool)(~(iVar37 < iVar32 || iVar32 == iVar37 && bVar9) & 1)) {
              pfVar25[uVar16 - 3] = fVar29;
            }
            if (iVar37 >= iVar32 && (iVar32 != iVar37 || !bVar9)) {
              pfVar25[uVar16 - 2] = fVar29;
            }
            auVar30 = (auVar30 | auVar38) ^ auVar40;
            iVar32 = auVar30._4_4_;
            if (iVar32 <= iVar37 && (iVar32 != iVar37 || auVar30._0_4_ <= iVar35)) {
              pfVar25[uVar16 - 1] = fVar29;
              pfVar25[uVar16] = fVar29;
            }
            uVar16 = uVar16 + 4;
          } while (local_78 != uVar16);
        }
        if (0 < (int)uVar4) {
          pvVar8 = local_b0->data;
          iVar32 = local_b0->w;
          sVar6 = local_b0->elemsize;
          uVar16 = 0;
          pfVar21 = pfVar17;
          do {
            if (0 < (int)uVar5) {
              uVar24 = 0;
              pvVar23 = (void *)((long)local_88 + (long)iVar15 * 4);
              do {
                if (0 < (int)uVar3) {
                  fVar29 = *(float *)((long)pvVar8 + (long)iVar32 * sVar6 * uVar24 + uVar16 * 4);
                  uVar19 = 0;
                  pfVar26 = pfVar21;
                  do {
                    *pfVar26 = *(float *)((long)pvVar23 + uVar19 * 4) * fVar29 + *pfVar26;
                    uVar19 = uVar19 + 1;
                    pfVar26 = pfVar26 + iVar18;
                  } while (uVar3 != uVar19);
                }
                uVar24 = uVar24 + 1;
                pvVar23 = (void *)((long)pvVar23 + (long)(int)uVar3 * 4);
              } while (uVar24 != uVar5);
            }
            uVar16 = uVar16 + 1;
            pfVar21 = (float *)((long)pfVar21 + local_60);
          } while (uVar16 != uVar4);
        }
        local_70 = uVar20;
        local_68 = pfVar25;
        if (0 < (int)local_a0) {
          pfVar25 = (float *)(this->activation_params).data;
          uVar20 = 0;
          do {
            fVar29 = pfVar17[uVar20];
            fVar34 = fVar29;
            switch(iVar2) {
            case 1:
              if (fVar29 <= 0.0) {
                fVar34 = 0.0;
              }
              break;
            case 2:
              fVar34 = (float)(~-(uint)(0.0 < fVar29) & (uint)*pfVar25 |
                              -(uint)(0.0 < fVar29) & 0x3f800000) * fVar29;
              break;
            case 3:
              if (fVar29 <= *pfVar25) {
                fVar29 = *pfVar25;
              }
              fVar34 = pfVar25[1];
              if (fVar29 <= pfVar25[1]) {
                fVar34 = fVar29;
              }
              break;
            case 4:
              if (88.37626 <= fVar29) {
                fVar29 = 88.37626;
              }
              fVar29 = expf((float)(-(uint)(fVar29 < -88.37626) & 0x42b0c0a5 |
                                   ~-(uint)(fVar29 < -88.37626) & ((uint)fVar29 ^ auVar40._0_4_)));
              auVar36 = local_58;
              auVar38 = _DAT_00552270;
              auVar39 = _DAT_00552280;
              auVar40 = _DAT_00552170;
              fVar34 = 1.0 / (fVar29 + 1.0);
              break;
            case 5:
              local_48 = ZEXT416((uint)fVar29);
              fVar29 = expf(fVar29);
              fVar29 = logf(fVar29 + 1.0);
              fVar29 = tanhf(fVar29);
              auVar36 = local_58;
              auVar38 = _DAT_00552270;
              auVar39 = _DAT_00552280;
              auVar40 = _DAT_00552170;
              fVar34 = fVar29 * (float)local_48._0_4_;
              break;
            case 6:
              fVar1 = *pfVar25;
              fVar33 = (float)((uint)pfVar25[1] ^ auVar40._0_4_) / fVar1;
              fVar34 = 0.0;
              if ((fVar33 <= fVar29) && (fVar34 = fVar29, fVar29 <= fVar33 + 1.0 / fVar1)) {
                fVar34 = (fVar1 * fVar29 + pfVar25[1]) * fVar29;
              }
            }
            pfVar17[uVar20] = fVar34;
            uVar20 = uVar20 + 1;
          } while (uVar22 != uVar20);
        }
        uVar20 = local_70 + 1;
        pfVar25 = (float *)((long)local_68 + local_80);
        pfVar17 = (float *)((long)pfVar17 + local_80);
        iVar15 = iVar15 + uVar3 * uVar5;
      } while (uVar20 != local_a8);
    }
    pMVar14 = local_98;
    cut_padding(this,&local_108,local_98,local_b8);
    if ((pMVar14->data == (void *)0x0) || (iVar18 = 0, (long)pMVar14->c * pMVar14->cstep == 0)) {
      iVar18 = -100;
    }
  }
  piVar7 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_108.allocator == (Allocator *)0x0) {
        if ((float *)local_108.data != (float *)0x0) {
          free(local_108.data);
        }
      }
      else {
        (*(local_108.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar18;
}

Assistant:

int Deconvolution1D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || output_w > 0)
    {
        top_blob_bordered.create(outw, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolution1d(bottom_blob, top_blob_bordered, weight_data, bias_data, kernel_w, stride_w, dilation_w, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}